

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_floor.cpp
# Opt level: O3

void __thiscall DWaggleBase::DoWaggle(DWaggleBase *this,bool ceiling)

{
  double *pdVar1;
  double dVar2;
  sector_t_conflict *sector;
  sector_t_conflict *sector_00;
  int iVar3;
  undefined7 in_register_00000031;
  long lVar4;
  double dVar5;
  double dVar6;
  
  sector = (this->super_DMover).super_DSectorEffect.m_Sector;
  lVar4 = 0xb0;
  if ((int)CONCAT71(in_register_00000031,ceiling) != 0) {
    lVar4 = 0xd8;
  }
  iVar3 = this->m_State;
  if (iVar3 == 3) {
    dVar6 = this->m_Scale - this->m_ScaleDelta;
    this->m_Scale = dVar6;
    if (dVar6 <= 0.0) {
      dVar6 = this->m_OriginalDist;
      dVar2 = *(double *)((long)&sector->planes[0].xform.xScale + lVar4);
      dVar5 = *(double *)((long)&sector->planes[0].xform.baseyOffs + lVar4);
      sector->planes[ceiling].TexZ =
           sector->planes[ceiling].TexZ -
           (dVar2 - dVar6) * *(double *)((long)&sector->planes[0].xform.yScale + lVar4);
      *(double *)((long)&sector->planes[0].xform.xScale + lVar4) = dVar6;
      P_ChangeSector(sector,1,(dVar6 - dVar2) / dVar5,(uint)ceiling,false);
      ((this->super_DMover).super_DSectorEffect.m_Sector)->interpolations[(ulong)ceiling - 3].
      field_0 = (anon_union_8_2_947301c2_for_TObjPtr<DInterpolation>_1)0x0;
      (*(this->super_DMover).super_DSectorEffect.super_DThinker.super_DObject._vptr_DObject[4])
                (this);
      return;
    }
    goto LAB_003f95a0;
  }
  if (iVar3 == 2) {
    if ((this->m_Ticker == -1) || (iVar3 = this->m_Ticker + -1, this->m_Ticker = iVar3, iVar3 != 0))
    goto LAB_003f95a0;
    iVar3 = 3;
  }
  else {
    if (iVar3 != 1) goto LAB_003f95a0;
    dVar6 = this->m_ScaleDelta + this->m_Scale;
    this->m_Scale = dVar6;
    if (dVar6 < this->m_TargetScale) goto LAB_003f95a0;
    this->m_Scale = this->m_TargetScale;
    iVar3 = 2;
  }
  this->m_State = iVar3;
LAB_003f95a0:
  dVar6 = this->m_OriginalDist;
  dVar5 = this->m_AccDelta + this->m_Accumulator;
  this->m_Accumulator = dVar5;
  dVar2 = *(double *)((long)&sector->planes[0].xform.xScale + lVar4);
  dVar5 = FFastTrig::sin(&fasttrig,dVar5 * 5.625 * 11930464.711111112 + 6755399441055744.0);
  pdVar1 = (double *)((long)&sector->planes[0].xform.yOffs + lVar4);
  dVar6 = dVar6 - (dVar5 * 8.0 * this->m_Scale * pdVar1[1] +
                  *(double *)((long)&sector->planes[0].xform.xOffs + lVar4) * 0.0 + *pdVar1 * 0.0);
  *(double *)((long)&sector->planes[0].xform.xScale + lVar4) = dVar6;
  sector_00 = (this->super_DMover).super_DSectorEffect.m_Sector;
  dVar6 = (dVar6 - dVar2) * *(double *)((long)&sector->planes[0].xform.yScale + lVar4);
  sector_00->planes[ceiling].TexZ = sector_00->planes[ceiling].TexZ + dVar6;
  P_Scroll3dMidtex(sector_00,1,dVar6,ceiling);
  P_MoveLinkedSectors((this->super_DMover).super_DSectorEffect.m_Sector,1,dVar6,ceiling);
  P_ChangeSector((this->super_DMover).super_DSectorEffect.m_Sector,1,dVar6,(uint)ceiling,false);
  return;
}

Assistant:

void DWaggleBase::DoWaggle (bool ceiling)
{
	secplane_t *plane;
	int pos;
	double dist;

	if (ceiling)
	{
		plane = &m_Sector->ceilingplane;
		pos = sector_t::ceiling;
	}
	else
	{
		plane = &m_Sector->floorplane;
		pos = sector_t::floor;
	}

	switch (m_State)
	{
	case WGLSTATE_EXPAND:
		if ((m_Scale += m_ScaleDelta) >= m_TargetScale)
		{
			m_Scale = m_TargetScale;
			m_State = WGLSTATE_STABLE;
		}
		break;

	case WGLSTATE_REDUCE:
		if ((m_Scale -= m_ScaleDelta) <= 0)
		{ // Remove
			dist = (m_OriginalDist - plane->fD()) / plane->fC();
			m_Sector->ChangePlaneTexZ(pos, -plane->HeightDiff (m_OriginalDist));
			plane->setD(m_OriginalDist);
			P_ChangeSector (m_Sector, true, dist, ceiling, false);
			if (ceiling)
			{
				m_Sector->ceilingdata = NULL;
			}
			else
			{
				m_Sector->floordata = NULL;
			}
			Destroy ();
			return;
		}
		break;

	case WGLSTATE_STABLE:
		if (m_Ticker != -1)
		{
			if (!--m_Ticker)
			{
				m_State = WGLSTATE_REDUCE;
			}
		}
		break;
	}
	m_Accumulator += m_AccDelta;

	dist = plane->fD();
	plane->setD(m_OriginalDist + plane->PointToDist (DVector2(0, 0), BobSin(m_Accumulator) *m_Scale));
	m_Sector->ChangePlaneTexZ(pos, plane->HeightDiff (dist));
	dist = plane->HeightDiff (dist);

	// Interesting: Hexen passes 'true' for the crunch parameter which really is crushing damage here...
	// Also, this does not reset the move if it blocks.
	P_Scroll3dMidtex(m_Sector, 1, dist, ceiling);
	P_MoveLinkedSectors(m_Sector, 1, dist, ceiling);
	P_ChangeSector (m_Sector, 1, dist, ceiling, false);
}